

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potions.cpp
# Opt level: O0

int turn_see(int turn_off)

{
  int iVar1;
  int iVar2;
  MonsterThing *mp_00;
  bool bVar3;
  int iVar4;
  reference ppMVar5;
  MonsterThing *mp;
  iterator __end1;
  iterator __begin1;
  list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *__range1;
  bool add_new;
  bool can_see;
  int turn_off_local;
  
  __range1._2_1_ = 0;
  __end1 = std::__cxx11::list<MonsterThing_*,_std::allocator<MonsterThing_*>_>::begin
                     (&mlist_abi_cxx11_);
  mp = (MonsterThing *)
       std::__cxx11::list<MonsterThing_*,_std::allocator<MonsterThing_*>_>::end(&mlist_abi_cxx11_);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&mp), bVar3) {
    ppMVar5 = std::_List_iterator<MonsterThing_*>::operator*(&__end1);
    mp_00 = *ppMVar5;
    bVar3 = see_monst(mp_00);
    if (turn_off == 0) {
      if (bVar3) {
        if ((player.flags & 0x800U) == 0) {
          setMapDisplay((mp_00->pos).x,(mp_00->pos).y,(int)mp_00->type);
        }
        else {
          iVar1 = (mp_00->pos).x;
          iVar2 = (mp_00->pos).y;
          iVar4 = rnd(0x1a);
          setMapDisplay(iVar1,iVar2,iVar4 + 0x41);
        }
      }
      else {
        if ((player.flags & 0x800U) == 0) {
          setMapDisplay((mp_00->pos).x,(mp_00->pos).y,(int)mp_00->type | 0x100);
        }
        else {
          iVar1 = (mp_00->pos).x;
          iVar2 = (mp_00->pos).y;
          iVar4 = rnd(0x1a);
          setMapDisplay(iVar1,iVar2,iVar4 + 0x41U | 0x100);
        }
        __range1._2_1_ = 1;
      }
    }
    else if (!bVar3) {
      setMapDisplay((mp_00->pos).x,(mp_00->pos).y,
                    (int)places[(mp_00->pos).x * 0x20 + (mp_00->pos).y].p_ch);
    }
    std::_List_iterator<MonsterThing_*>::operator++(&__end1);
  }
  if (turn_off == 0) {
    player.flags = player.flags | 0x4000;
  }
  else {
    player.flags = player.flags & 0xffffbfff;
  }
  return (int)__range1._2_1_;
}

Assistant:

int turn_see(int turn_off)
{
    bool can_see, add_new;

    add_new = false;
    for (MonsterThing* mp : mlist)
    {
        can_see = see_monst(mp);
        if (turn_off)
        {
            if (!can_see)
                setMapDisplay(mp->pos.x, mp->pos.y, char_at(mp->pos.x, mp->pos.y));
        }
        else
        {
            if (!can_see)
            {
                if (!on(player, ISHALU))
                    setMapDisplay(mp->pos.x, mp->pos.y, mp->type | DISPLAY_INVERT);
                else
                    setMapDisplay(mp->pos.x, mp->pos.y, (rnd(26) + 'A')  | DISPLAY_INVERT);
                add_new++;
            }else{
                if (!on(player, ISHALU))
                    setMapDisplay(mp->pos.x, mp->pos.y, mp->type);
                else
                    setMapDisplay(mp->pos.x, mp->pos.y, rnd(26) + 'A');
            }
        }
    }
    if (turn_off)
        player.flags &= ~SEEMONST;
    else
        player.flags |= SEEMONST;
    return add_new;
}